

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O0

void __thiscall
pbrt::ExhaustiveLightSampler::ExhaustiveLightSampler
          (ExhaustiveLightSampler *this,span<const_pbrt::Light> lights,Allocator alloc)

{
  undefined1 uVar1;
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *this_00;
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *key;
  long in_RDI;
  optional<pbrt::LightBounds> lb;
  Light *light;
  iterator __end1;
  iterator __begin1;
  span<const_pbrt::Light> *__range1;
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *in_stack_fffffffffffffe98;
  polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>
  in_stack_fffffffffffffea0;
  LightBounds *in_stack_fffffffffffffea8;
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *in_stack_fffffffffffffeb0;
  Light *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  optional local_b0 [56];
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *local_78;
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *local_70;
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  *local_68;
  span<const_pbrt::Light> *local_60;
  polymorphic_allocator<pbrt::LightBounds> local_50;
  polymorphic_allocator<pbrt::Light> local_48 [3];
  polymorphic_allocator<pbrt::Light> local_30 [4];
  span<const_pbrt::Light> local_10;
  
  pstd::span<const_pbrt::Light>::begin(&local_10);
  pstd::span<const_pbrt::Light>::end(&local_10);
  pstd::pmr::polymorphic_allocator<pbrt::Light>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::Light> *)in_stack_fffffffffffffea0.memoryResource,
             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe98);
  pstd::vector<pbrt::Light,pstd::pmr::polymorphic_allocator<pbrt::Light>>::
  vector<pbrt::Light_const*>
            ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
             ,(Light *)in_stack_fffffffffffffeb0,
             (polymorphic_allocator<pbrt::Light> *)in_stack_fffffffffffffea8);
  pstd::pmr::polymorphic_allocator<pbrt::Light>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::Light> *)in_stack_fffffffffffffea0.memoryResource,
             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe98);
  pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::vector
            ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)(in_RDI + 0x20),
             local_30);
  pstd::pmr::polymorphic_allocator<pbrt::Light>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::Light> *)in_stack_fffffffffffffea0.memoryResource,
             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe98);
  pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::vector
            ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)(in_RDI + 0x40),
             local_48);
  pstd::pmr::polymorphic_allocator<pbrt::LightBounds>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::LightBounds> *)in_stack_fffffffffffffea0.memoryResource,
             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe98);
  pstd::vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_>::vector
            ((vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_> *)
             (in_RDI + 0x60),&local_50);
  pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>::
  polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_> *)
             in_stack_fffffffffffffea0.memoryResource,
             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe98);
  HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
  ::HashMap(in_stack_fffffffffffffe98,in_stack_fffffffffffffea0);
  local_60 = &local_10;
  this_00 = (HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
             *)pstd::span<const_pbrt::Light>::begin(local_60);
  local_68 = this_00;
  key = (HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
         *)pstd::span<const_pbrt::Light>::end(local_60);
  local_70 = key;
  for (; local_68 != local_70;
      local_68 = (HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
                  *)&(local_68->table).ptr) {
    local_78 = local_68;
    Light::Bounds((Light *)in_stack_fffffffffffffea8);
    uVar1 = pstd::optional::operator_cast_to_bool(local_b0);
    if ((bool)uVar1) {
      in_stack_fffffffffffffea8 = (LightBounds *)(in_RDI + 0x80);
      in_stack_fffffffffffffeb0 = local_78;
      pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::size
                ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                 (in_RDI + 0x20));
      HashMap<pbrt::Light,_unsigned_long,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_long>_>_>_>
      ::Insert(this_00,(Light *)key,(unsigned_long *)CONCAT17(uVar1,in_stack_fffffffffffffec0));
      pstd::optional<pbrt::LightBounds>::operator*((optional<pbrt::LightBounds> *)0x7a2c5a);
      pstd::vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_>::
      push_back((vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_> *)
                in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::push_back
                ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                 in_stack_fffffffffffffeb0,(Light *)in_stack_fffffffffffffea8);
    }
    else {
      pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::push_back
                ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                 in_stack_fffffffffffffeb0,(Light *)in_stack_fffffffffffffea8);
    }
    pstd::optional<pbrt::LightBounds>::~optional((optional<pbrt::LightBounds> *)0x7a2d52);
  }
  return;
}

Assistant:

ExhaustiveLightSampler::ExhaustiveLightSampler(pstd::span<const Light> lights,
                                               Allocator alloc)
    : lights(lights.begin(), lights.end(), alloc),
      boundedLights(alloc),
      infiniteLights(alloc),
      lightBounds(alloc),
      lightToBoundedIndex(alloc) {
    for (const auto &light : lights) {
        if (pstd::optional<LightBounds> lb = light.Bounds(); lb) {
            lightToBoundedIndex.Insert(light, boundedLights.size());
            lightBounds.push_back(*lb);
            boundedLights.push_back(light);
        } else
            infiniteLights.push_back(light);
    }
}